

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.cpp
# Opt level: O2

void __thiscall MinVR::VRSearchPlugin::VRSearchPlugin(VRSearchPlugin *this)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  allocator<char> local_31;
  string local_30;
  
  plVar1 = &(this->super_VRSearchPath)._searchPath;
  (this->super_VRSearchPath)._searchPath.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_VRSearchPath)._searchPath.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_VRSearchPath)._searchPath.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->super_VRSearchPath)._vptr_VRSearchPath = (_func_int **)&PTR__selectFile_0015c878;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"./",&local_31);
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"${MINVR_ROOT}/lib/MinVR-2.0/",&local_31);
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"${MINVR_ROOT}/bin/MinVR-2.0/",&local_31);
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/build_O2/install/lib/MinVR-2.0/"
             ,&local_31);
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/build_O2/lib/",
             &local_31);
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

VRSearchPlugin::VRSearchPlugin() {

  // 1. already added externally

  // 2. current working directory
  addPathEntry("./", false);

  // 3. installation pointed to by the $MINVR_ROOT$ envvar
  addPathEntry("${MINVR_ROOT}/lib/MinVR" MINVR_VERSION_STR "/", false);
  addPathEntry("${MINVR_ROOT}/bin/MinVR" MINVR_VERSION_STR "/", false);

  // 4. installation prefix #defined in VRConfig.h (set by cmake)
  addPathEntry(MINVR_INSTALL_PLUGIN_DIR "/", false);

  // 5. build directory #defined in VRConfig.h (set by cmake)
  addPathEntry(MINVR_BUILD_PLUGIN_DIR "/", false);
}